

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O3

void __thiscall pmx::PmxSetting::Read(PmxSetting *this,istream *stream)

{
  undefined8 in_RAX;
  uint uVar1;
  uint8_t count;
  uint8_t temp;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::istream::read((char *)stream,(long)&uStack_28 + 6);
  if (7 < uStack_28._6_1_) {
    std::istream::read((char *)stream,(long)this);
    std::istream::read((char *)stream,(long)&this->uv);
    std::istream::read((char *)stream,(long)&this->vertex_index_size);
    std::istream::read((char *)stream,(long)&this->texture_index_size);
    std::istream::read((char *)stream,(long)&this->material_index_size);
    std::istream::read((char *)stream,(long)&this->bone_index_size);
    std::istream::read((char *)stream,(long)&this->morph_index_size);
    std::istream::read((char *)stream,(long)&this->rigidbody_index_size);
    if (8 < uStack_28._6_1_) {
      uVar1 = 8;
      do {
        std::istream::read((char *)stream,(long)&uStack_28 + 7);
        uVar1 = uVar1 + 1;
      } while (uVar1 < uStack_28._6_1_);
    }
    return;
  }
  __cxa_rethrow();
}

Assistant:

void PmxSetting::Read(std::istream *stream)
	{
		uint8_t count;
		stream->read((char*) &count, sizeof(uint8_t));
		if (count < 8)
		{
			throw;
		}
		stream->read((char*) &encoding, sizeof(uint8_t));
		stream->read((char*) &uv, sizeof(uint8_t));
		stream->read((char*) &vertex_index_size, sizeof(uint8_t));
		stream->read((char*) &texture_index_size, sizeof(uint8_t));
		stream->read((char*) &material_index_size, sizeof(uint8_t));
		stream->read((char*) &bone_index_size, sizeof(uint8_t));
		stream->read((char*) &morph_index_size, sizeof(uint8_t));
		stream->read((char*) &rigidbody_index_size, sizeof(uint8_t));
		uint8_t temp;
		for (int i = 8; i < count; i++)
		{
			stream->read((char*)&temp, sizeof(uint8_t));
		}
	}